

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  ulong uVar24;
  undefined8 uVar25;
  ushort uVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [16];
  undefined1 auVar138 [40];
  undefined1 auVar139 [48];
  undefined1 auVar140 [56];
  undefined1 auVar141 [40];
  undefined1 auVar142 [48];
  undefined1 auVar143 [56];
  undefined1 auVar144 [24];
  int iVar145;
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar151 [32];
  undefined1 auVar155 [32];
  __m128 _outp_2;
  __m128 _p_2;
  __m128 _b;
  __m256 _outp_1;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _outp;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  int size;
  binary_op_rpow op;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx;
  __m512 tmp_1;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  int local_45f4;
  undefined8 *local_45e0;
  undefined1 (*local_45d0) [64];
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined1 local_42c0 [8];
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 uStack_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined1 local_41c0 [16];
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 uStack_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined1 local_3e80 [256];
  undefined1 local_3d80 [16];
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 uStack_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined1 local_3c80 [16];
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 uStack_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  int local_2ac0;
  int iStack_2abc;
  int iStack_2ab8;
  int iStack_2ab4;
  int iStack_2ab0;
  int iStack_2aac;
  int iStack_2aa8;
  int iStack_2aa4;
  int iStack_2aa0;
  int iStack_2a9c;
  int iStack_2a98;
  int iStack_2a94;
  int iStack_2a90;
  int iStack_2a8c;
  int iStack_2a88;
  int iStack_2a84;
  int local_2940;
  int iStack_293c;
  int iStack_2938;
  int iStack_2934;
  int iStack_2930;
  int iStack_292c;
  int iStack_2928;
  int iStack_2924;
  int iStack_2920;
  int iStack_291c;
  int iStack_2918;
  int iStack_2914;
  int iStack_2910;
  int iStack_290c;
  int iStack_2908;
  int iStack_2904;
  int local_2080;
  int iStack_207c;
  int iStack_2078;
  int iStack_2074;
  int iStack_2070;
  int iStack_206c;
  int iStack_2068;
  int iStack_2064;
  int iStack_2060;
  int iStack_205c;
  int iStack_2058;
  int iStack_2054;
  int iStack_2050;
  int iStack_204c;
  int iStack_2048;
  int iStack_2044;
  float local_1f40;
  float fStack_1f3c;
  float fStack_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float fStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  undefined4 uStack_1f04;
  undefined1 local_1ee0 [8];
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1e80 [16];
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e40 [8];
  float fStack_1e38;
  float fStack_1e34;
  undefined1 local_1e20 [8];
  float fStack_1e18;
  float fStack_1e14;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  undefined1 local_1c80 [8];
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  undefined4 uStack_1c64;
  undefined1 local_1c00 [8];
  float fStack_1bf8;
  float fStack_1bf4;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined1 local_1b80 [8];
  float fStack_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float fStack_1b68;
  float fStack_1b64;
  float local_1b60;
  float fStack_1b5c;
  float fStack_1b58;
  float fStack_1b54;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  float local_19c0;
  float fStack_19bc;
  float fStack_19b8;
  float fStack_19b4;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float local_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 local_af0 [8];
  undefined8 uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined8 local_a90;
  undefined8 uStack_a88;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  
  iVar145 = in_ECX * in_R8D;
  local_45f4 = 0;
  auVar146 = vbroadcastss_avx512f(ZEXT416(*in_RSI));
  local_45e0 = in_RDX;
  local_45d0 = in_RDI;
  for (; local_45f4 + 0xf < iVar145; local_45f4 = local_45f4 + 0x10) {
    uVar24 = vcmpps_avx512f(auVar146,ZEXT1664(ZEXT816(0)),2);
    auVar33._8_4_ = 0x800000;
    auVar33._12_4_ = 0x800000;
    auVar33._0_4_ = 0x800000;
    auVar33._4_4_ = 0x800000;
    auVar33._16_4_ = 0x800000;
    auVar33._20_4_ = 0x800000;
    auVar33._24_4_ = 0x800000;
    auVar33._28_4_ = 0x800000;
    auVar33._32_4_ = 0x800000;
    auVar33._36_4_ = 0x800000;
    auVar33._40_4_ = 0x800000;
    auVar33._44_4_ = 0x800000;
    auVar33._48_4_ = 0x800000;
    auVar33._52_4_ = 0x800000;
    auVar33._56_4_ = 0x800000;
    auVar33._60_4_ = 0x800000;
    auVar147 = vmaxps_avx512f(auVar146,auVar33);
    auVar148 = vmovdqa64_avx512f(auVar147);
    auVar148 = vpsrld_avx512f(auVar148,ZEXT416(0x17));
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar147 = vmovdqa64_avx512f(auVar147);
    auVar71._8_4_ = -0x7f800001;
    auVar71._12_4_ = -0x7f800001;
    auVar71._0_4_ = -0x7f800001;
    auVar71._4_4_ = -0x7f800001;
    auVar71._16_4_ = -0x7f800001;
    auVar71._20_4_ = -0x7f800001;
    auVar71._24_4_ = -0x7f800001;
    auVar71._28_4_ = -0x7f800001;
    auVar71._32_4_ = -0x7f800001;
    auVar71._36_4_ = -0x7f800001;
    auVar71._40_4_ = -0x7f800001;
    auVar71._44_4_ = -0x7f800001;
    auVar71._48_4_ = -0x7f800001;
    auVar71._52_4_ = -0x7f800001;
    auVar71._56_4_ = -0x7f800001;
    auVar71._60_4_ = -0x7f800001;
    auVar149 = vmovdqa64_avx512f(auVar71);
    auVar147 = vpandd_avx512f(auVar147,auVar149);
    auVar147 = vmovdqa64_avx512f(auVar147);
    auVar147 = vmovdqa64_avx512f(auVar147);
    auVar72._8_4_ = 0.5;
    auVar72._12_4_ = 0.5;
    auVar72._0_4_ = 0.5;
    auVar72._4_4_ = 0.5;
    auVar72._16_4_ = 0.5;
    auVar72._20_4_ = 0.5;
    auVar72._24_4_ = 0.5;
    auVar72._28_4_ = 0.5;
    auVar72._32_4_ = 0.5;
    auVar72._36_4_ = 0.5;
    auVar72._40_4_ = 0.5;
    auVar72._44_4_ = 0.5;
    auVar72._48_4_ = 0.5;
    auVar72._52_4_ = 0.5;
    auVar72._56_4_ = 0.5;
    auVar72._60_4_ = 0.5;
    auVar149 = vmovdqa64_avx512f(auVar72);
    auVar147 = vpord_avx512f(auVar147,auVar149);
    auVar147 = vmovdqa64_avx512f(auVar147);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar149 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar149 = vmovdqa64_avx512f(auVar149);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar149 = vmovdqa64_avx512f(auVar149);
    auVar148 = vpsubd_avx512f(auVar148,auVar149);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vcvtdq2ps_avx512f(auVar148);
    auVar28._8_4_ = 1.0;
    auVar28._12_4_ = 1.0;
    auVar28._0_4_ = 1.0;
    auVar28._4_4_ = 1.0;
    auVar28._16_4_ = 1.0;
    auVar28._20_4_ = 1.0;
    auVar28._24_4_ = 1.0;
    auVar28._28_4_ = 1.0;
    auVar28._32_4_ = 1.0;
    auVar28._36_4_ = 1.0;
    auVar28._40_4_ = 1.0;
    auVar28._44_4_ = 1.0;
    auVar28._48_4_ = 1.0;
    auVar28._52_4_ = 1.0;
    auVar28._56_4_ = 1.0;
    auVar28._60_4_ = 1.0;
    auVar148 = vaddps_avx512f(auVar148,auVar28);
    uVar25 = vcmpps_avx512f(auVar147,(undefined1  [64])_ps512_cephes_SQRTHF,1);
    uVar26 = (ushort)uVar25;
    auVar29._8_4_ = 1.0;
    auVar29._12_4_ = 1.0;
    auVar29._0_4_ = 1.0;
    auVar29._4_4_ = 1.0;
    auVar29._16_4_ = 1.0;
    auVar29._20_4_ = 1.0;
    auVar29._24_4_ = 1.0;
    auVar29._28_4_ = 1.0;
    auVar29._32_4_ = 1.0;
    auVar29._36_4_ = 1.0;
    auVar29._40_4_ = 1.0;
    auVar29._44_4_ = 1.0;
    auVar29._48_4_ = 1.0;
    auVar29._52_4_ = 1.0;
    auVar29._56_4_ = 1.0;
    auVar29._60_4_ = 1.0;
    auVar149 = vsubps_avx512f(auVar147,auVar29);
    auVar63._8_4_ = 1.0;
    auVar63._12_4_ = 1.0;
    auVar63._0_4_ = 1.0;
    auVar63._4_4_ = 1.0;
    auVar63._16_4_ = 1.0;
    auVar63._20_4_ = 1.0;
    auVar63._24_4_ = 1.0;
    auVar63._28_4_ = 1.0;
    auVar63._32_4_ = 1.0;
    auVar63._36_4_ = 1.0;
    auVar63._40_4_ = 1.0;
    auVar63._44_4_ = 1.0;
    auVar63._48_4_ = 1.0;
    auVar63._52_4_ = 1.0;
    auVar63._56_4_ = 1.0;
    auVar63._60_4_ = 1.0;
    local_2ac0 = auVar148._0_4_;
    iStack_2abc = auVar148._4_4_;
    iStack_2ab8 = auVar148._8_4_;
    iStack_2ab4 = auVar148._12_4_;
    iStack_2ab0 = auVar148._16_4_;
    iStack_2aac = auVar148._20_4_;
    iStack_2aa8 = auVar148._24_4_;
    iStack_2aa4 = auVar148._28_4_;
    iStack_2aa0 = auVar148._32_4_;
    iStack_2a9c = auVar148._36_4_;
    iStack_2a98 = auVar148._40_4_;
    iStack_2a94 = auVar148._44_4_;
    iStack_2a90 = auVar148._48_4_;
    iStack_2a8c = auVar148._52_4_;
    iStack_2a88 = auVar148._56_4_;
    iStack_2a84 = auVar148._60_4_;
    auVar148 = vsubps_avx512f(auVar148,auVar63);
    bVar2 = (bool)((byte)uVar25 & 1);
    bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
    bVar10 = (byte)((ulong)uVar25 >> 8);
    bVar11 = (bool)(bVar10 >> 1 & 1);
    bVar12 = (bool)(bVar10 >> 2 & 1);
    bVar13 = (bool)(bVar10 >> 3 & 1);
    bVar14 = (bool)(bVar10 >> 4 & 1);
    bVar15 = (bool)(bVar10 >> 5 & 1);
    bVar16 = (bool)(bVar10 >> 6 & 1);
    local_3d80._4_4_ = (uint)bVar3 * auVar148._4_4_ | (uint)!bVar3 * iStack_2abc;
    local_3d80._0_4_ = (uint)bVar2 * auVar148._0_4_ | (uint)!bVar2 * local_2ac0;
    local_3d80._8_4_ = (uint)bVar4 * auVar148._8_4_ | (uint)!bVar4 * iStack_2ab8;
    local_3d80._12_4_ = (uint)bVar5 * auVar148._12_4_ | (uint)!bVar5 * iStack_2ab4;
    uStack_3d70._0_4_ = (uint)bVar6 * auVar148._16_4_ | (uint)!bVar6 * iStack_2ab0;
    uStack_3d70._4_4_ = (uint)bVar7 * auVar148._20_4_ | (uint)!bVar7 * iStack_2aac;
    uStack_3d68._0_4_ = (uint)bVar8 * auVar148._24_4_ | (uint)!bVar8 * iStack_2aa8;
    uStack_3d68._4_4_ = (uint)bVar9 * auVar148._28_4_ | (uint)!bVar9 * iStack_2aa4;
    auVar17 = _local_3d80;
    uStack_3d60._0_4_ =
         (uint)(bVar10 & 1) * auVar148._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_2aa0;
    uStack_3d60._4_4_ = (uint)bVar11 * auVar148._36_4_ | (uint)!bVar11 * iStack_2a9c;
    auVar138 = _local_3d80;
    uStack_3d58._0_4_ = (uint)bVar12 * auVar148._40_4_ | (uint)!bVar12 * iStack_2a98;
    uStack_3d58._4_4_ = (uint)bVar13 * auVar148._44_4_ | (uint)!bVar13 * iStack_2a94;
    auVar139 = _local_3d80;
    uStack_3d50._0_4_ = (uint)bVar14 * auVar148._48_4_ | (uint)!bVar14 * iStack_2a90;
    uStack_3d50._4_4_ = (uint)bVar15 * auVar148._52_4_ | (uint)!bVar15 * iStack_2a8c;
    auVar140 = _local_3d80;
    uStack_3d48._0_4_ = (uint)bVar16 * auVar148._56_4_ | (uint)!bVar16 * iStack_2a88;
    uStack_3d48._4_4_ =
         (uint)(bVar10 >> 7) * auVar148._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_2a84;
    auVar148 = _local_3d80;
    local_2080 = auVar149._0_4_;
    iStack_207c = auVar149._4_4_;
    iStack_2078 = auVar149._8_4_;
    iStack_2074 = auVar149._12_4_;
    iStack_2070 = auVar149._16_4_;
    iStack_206c = auVar149._20_4_;
    iStack_2068 = auVar149._24_4_;
    iStack_2064 = auVar149._28_4_;
    iStack_2060 = auVar149._32_4_;
    iStack_205c = auVar149._36_4_;
    iStack_2058 = auVar149._40_4_;
    iStack_2054 = auVar149._44_4_;
    iStack_2050 = auVar149._48_4_;
    iStack_204c = auVar149._52_4_;
    iStack_2048 = auVar149._56_4_;
    iStack_2044 = auVar149._60_4_;
    auVar147 = vaddps_avx512f(auVar149,auVar147);
    bVar2 = (bool)((byte)uVar25 & 1);
    bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
    bVar11 = (bool)(bVar10 >> 1 & 1);
    bVar12 = (bool)(bVar10 >> 2 & 1);
    bVar13 = (bool)(bVar10 >> 3 & 1);
    bVar14 = (bool)(bVar10 >> 4 & 1);
    bVar15 = (bool)(bVar10 >> 5 & 1);
    bVar16 = (bool)(bVar10 >> 6 & 1);
    local_3c80._4_4_ = (uint)bVar3 * auVar147._4_4_ | (uint)!bVar3 * iStack_207c;
    local_3c80._0_4_ = (uint)bVar2 * auVar147._0_4_ | (uint)!bVar2 * local_2080;
    local_3c80._8_4_ = (uint)bVar4 * auVar147._8_4_ | (uint)!bVar4 * iStack_2078;
    local_3c80._12_4_ = (uint)bVar5 * auVar147._12_4_ | (uint)!bVar5 * iStack_2074;
    uStack_3c70._0_4_ = (uint)bVar6 * auVar147._16_4_ | (uint)!bVar6 * iStack_2070;
    uStack_3c70._4_4_ = (uint)bVar7 * auVar147._20_4_ | (uint)!bVar7 * iStack_206c;
    uStack_3c68._0_4_ = (uint)bVar8 * auVar147._24_4_ | (uint)!bVar8 * iStack_2068;
    uStack_3c68._4_4_ = (uint)bVar9 * auVar147._28_4_ | (uint)!bVar9 * iStack_2064;
    auVar151 = _local_3c80;
    uStack_3c60._0_4_ =
         (uint)(bVar10 & 1) * auVar147._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_2060;
    uStack_3c60._4_4_ = (uint)bVar11 * auVar147._36_4_ | (uint)!bVar11 * iStack_205c;
    auVar141 = _local_3c80;
    uStack_3c58._0_4_ = (uint)bVar12 * auVar147._40_4_ | (uint)!bVar12 * iStack_2058;
    uStack_3c58._4_4_ = (uint)bVar13 * auVar147._44_4_ | (uint)!bVar13 * iStack_2054;
    auVar142 = _local_3c80;
    uStack_3c50._0_4_ = (uint)bVar14 * auVar147._48_4_ | (uint)!bVar14 * iStack_2050;
    uStack_3c50._4_4_ = (uint)bVar15 * auVar147._52_4_ | (uint)!bVar15 * iStack_204c;
    auVar143 = _local_3c80;
    uStack_3c48._0_4_ = (uint)bVar16 * auVar147._56_4_ | (uint)!bVar16 * iStack_2048;
    uStack_3c48._4_4_ =
         (uint)(bVar10 >> 7) * auVar147._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_2044;
    auVar147 = _local_3c80;
    uStack_3c68 = auVar151._24_8_;
    uStack_3c60 = auVar141._32_8_;
    uStack_3c58 = auVar142._40_8_;
    uStack_3c50 = auVar143._48_8_;
    uStack_3c48 = auVar147._56_8_;
    auVar32._16_8_ = uStack_3c70;
    auVar32._0_16_ = local_3c80;
    auVar32._24_8_ = uStack_3c68;
    auVar32._32_8_ = uStack_3c60;
    auVar32._40_8_ = uStack_3c58;
    auVar32._48_8_ = uStack_3c50;
    auVar32._56_8_ = uStack_3c48;
    auVar31._16_8_ = uStack_3c70;
    auVar31._0_16_ = local_3c80;
    auVar31._24_8_ = uStack_3c68;
    auVar31._32_8_ = uStack_3c60;
    auVar31._40_8_ = uStack_3c58;
    auVar31._48_8_ = uStack_3c50;
    auVar31._56_8_ = uStack_3c48;
    auVar147 = vmulps_avx512f(auVar32,auVar31);
    local_3e80._8_4_ = 0.070376836;
    local_3e80._12_4_ = 0.070376836;
    local_3e80._0_4_ = 0.070376836;
    local_3e80._4_4_ = 0.070376836;
    auVar54._16_4_ = 0.070376836;
    auVar54._20_4_ = 0.070376836;
    auVar54._0_16_ = local_3e80._0_16_;
    auVar54._24_4_ = 0.070376836;
    auVar54._28_4_ = 0.070376836;
    auVar54._32_4_ = 0.070376836;
    auVar54._36_4_ = 0.070376836;
    auVar54._40_4_ = 0.070376836;
    auVar54._44_4_ = 0.070376836;
    auVar54._48_4_ = 0.070376836;
    auVar54._52_4_ = 0.070376836;
    auVar54._56_4_ = 0.070376836;
    auVar54._60_4_ = 0.070376836;
    auVar53._16_8_ = uStack_3c70;
    auVar53._0_16_ = local_3c80;
    auVar53._24_8_ = uStack_3c68;
    auVar53._32_8_ = uStack_3c60;
    auVar53._40_8_ = uStack_3c58;
    auVar53._48_8_ = uStack_3c50;
    auVar53._56_8_ = uStack_3c48;
    auVar52._8_4_ = -0.1151461;
    auVar52._12_4_ = -0.1151461;
    auVar52._0_4_ = -0.1151461;
    auVar52._4_4_ = -0.1151461;
    auVar52._16_4_ = -0.1151461;
    auVar52._20_4_ = -0.1151461;
    auVar52._24_4_ = -0.1151461;
    auVar52._28_4_ = -0.1151461;
    auVar52._32_4_ = -0.1151461;
    auVar52._36_4_ = -0.1151461;
    auVar52._40_4_ = -0.1151461;
    auVar52._44_4_ = -0.1151461;
    auVar52._48_4_ = -0.1151461;
    auVar52._52_4_ = -0.1151461;
    auVar52._56_4_ = -0.1151461;
    auVar52._60_4_ = -0.1151461;
    auVar149 = vfmadd213ps_avx512f(auVar53,auVar54,auVar52);
    auVar51._16_8_ = uStack_3c70;
    auVar51._0_16_ = local_3c80;
    auVar51._24_8_ = uStack_3c68;
    auVar51._32_8_ = uStack_3c60;
    auVar51._40_8_ = uStack_3c58;
    auVar51._48_8_ = uStack_3c50;
    auVar51._56_8_ = uStack_3c48;
    auVar50._8_4_ = 0.116769984;
    auVar50._12_4_ = 0.116769984;
    auVar50._0_4_ = 0.116769984;
    auVar50._4_4_ = 0.116769984;
    auVar50._16_4_ = 0.116769984;
    auVar50._20_4_ = 0.116769984;
    auVar50._24_4_ = 0.116769984;
    auVar50._28_4_ = 0.116769984;
    auVar50._32_4_ = 0.116769984;
    auVar50._36_4_ = 0.116769984;
    auVar50._40_4_ = 0.116769984;
    auVar50._44_4_ = 0.116769984;
    auVar50._48_4_ = 0.116769984;
    auVar50._52_4_ = 0.116769984;
    auVar50._56_4_ = 0.116769984;
    auVar50._60_4_ = 0.116769984;
    auVar149 = vfmadd213ps_avx512f(auVar51,auVar149,auVar50);
    auVar49._16_8_ = uStack_3c70;
    auVar49._0_16_ = local_3c80;
    auVar49._24_8_ = uStack_3c68;
    auVar49._32_8_ = uStack_3c60;
    auVar49._40_8_ = uStack_3c58;
    auVar49._48_8_ = uStack_3c50;
    auVar49._56_8_ = uStack_3c48;
    auVar48._8_4_ = -0.12420141;
    auVar48._12_4_ = -0.12420141;
    auVar48._0_4_ = -0.12420141;
    auVar48._4_4_ = -0.12420141;
    auVar48._16_4_ = -0.12420141;
    auVar48._20_4_ = -0.12420141;
    auVar48._24_4_ = -0.12420141;
    auVar48._28_4_ = -0.12420141;
    auVar48._32_4_ = -0.12420141;
    auVar48._36_4_ = -0.12420141;
    auVar48._40_4_ = -0.12420141;
    auVar48._44_4_ = -0.12420141;
    auVar48._48_4_ = -0.12420141;
    auVar48._52_4_ = -0.12420141;
    auVar48._56_4_ = -0.12420141;
    auVar48._60_4_ = -0.12420141;
    auVar149 = vfmadd213ps_avx512f(auVar49,auVar149,auVar48);
    auVar47._16_8_ = uStack_3c70;
    auVar47._0_16_ = local_3c80;
    auVar47._24_8_ = uStack_3c68;
    auVar47._32_8_ = uStack_3c60;
    auVar47._40_8_ = uStack_3c58;
    auVar47._48_8_ = uStack_3c50;
    auVar47._56_8_ = uStack_3c48;
    auVar46._8_4_ = 0.14249323;
    auVar46._12_4_ = 0.14249323;
    auVar46._0_4_ = 0.14249323;
    auVar46._4_4_ = 0.14249323;
    auVar46._16_4_ = 0.14249323;
    auVar46._20_4_ = 0.14249323;
    auVar46._24_4_ = 0.14249323;
    auVar46._28_4_ = 0.14249323;
    auVar46._32_4_ = 0.14249323;
    auVar46._36_4_ = 0.14249323;
    auVar46._40_4_ = 0.14249323;
    auVar46._44_4_ = 0.14249323;
    auVar46._48_4_ = 0.14249323;
    auVar46._52_4_ = 0.14249323;
    auVar46._56_4_ = 0.14249323;
    auVar46._60_4_ = 0.14249323;
    auVar149 = vfmadd213ps_avx512f(auVar47,auVar149,auVar46);
    auVar45._16_8_ = uStack_3c70;
    auVar45._0_16_ = local_3c80;
    auVar45._24_8_ = uStack_3c68;
    auVar45._32_8_ = uStack_3c60;
    auVar45._40_8_ = uStack_3c58;
    auVar45._48_8_ = uStack_3c50;
    auVar45._56_8_ = uStack_3c48;
    auVar44._8_4_ = -0.16668057;
    auVar44._12_4_ = -0.16668057;
    auVar44._0_4_ = -0.16668057;
    auVar44._4_4_ = -0.16668057;
    auVar44._16_4_ = -0.16668057;
    auVar44._20_4_ = -0.16668057;
    auVar44._24_4_ = -0.16668057;
    auVar44._28_4_ = -0.16668057;
    auVar44._32_4_ = -0.16668057;
    auVar44._36_4_ = -0.16668057;
    auVar44._40_4_ = -0.16668057;
    auVar44._44_4_ = -0.16668057;
    auVar44._48_4_ = -0.16668057;
    auVar44._52_4_ = -0.16668057;
    auVar44._56_4_ = -0.16668057;
    auVar44._60_4_ = -0.16668057;
    auVar149 = vfmadd213ps_avx512f(auVar45,auVar149,auVar44);
    auVar43._16_8_ = uStack_3c70;
    auVar43._0_16_ = local_3c80;
    auVar43._24_8_ = uStack_3c68;
    auVar43._32_8_ = uStack_3c60;
    auVar43._40_8_ = uStack_3c58;
    auVar43._48_8_ = uStack_3c50;
    auVar43._56_8_ = uStack_3c48;
    auVar42._8_4_ = 0.20000714;
    auVar42._12_4_ = 0.20000714;
    auVar42._0_4_ = 0.20000714;
    auVar42._4_4_ = 0.20000714;
    auVar42._16_4_ = 0.20000714;
    auVar42._20_4_ = 0.20000714;
    auVar42._24_4_ = 0.20000714;
    auVar42._28_4_ = 0.20000714;
    auVar42._32_4_ = 0.20000714;
    auVar42._36_4_ = 0.20000714;
    auVar42._40_4_ = 0.20000714;
    auVar42._44_4_ = 0.20000714;
    auVar42._48_4_ = 0.20000714;
    auVar42._52_4_ = 0.20000714;
    auVar42._56_4_ = 0.20000714;
    auVar42._60_4_ = 0.20000714;
    auVar149 = vfmadd213ps_avx512f(auVar43,auVar149,auVar42);
    auVar41._16_8_ = uStack_3c70;
    auVar41._0_16_ = local_3c80;
    auVar41._24_8_ = uStack_3c68;
    auVar41._32_8_ = uStack_3c60;
    auVar41._40_8_ = uStack_3c58;
    auVar41._48_8_ = uStack_3c50;
    auVar41._56_8_ = uStack_3c48;
    auVar40._8_4_ = -0.24999994;
    auVar40._12_4_ = -0.24999994;
    auVar40._0_4_ = -0.24999994;
    auVar40._4_4_ = -0.24999994;
    auVar40._16_4_ = -0.24999994;
    auVar40._20_4_ = -0.24999994;
    auVar40._24_4_ = -0.24999994;
    auVar40._28_4_ = -0.24999994;
    auVar40._32_4_ = -0.24999994;
    auVar40._36_4_ = -0.24999994;
    auVar40._40_4_ = -0.24999994;
    auVar40._44_4_ = -0.24999994;
    auVar40._48_4_ = -0.24999994;
    auVar40._52_4_ = -0.24999994;
    auVar40._56_4_ = -0.24999994;
    auVar40._60_4_ = -0.24999994;
    auVar149 = vfmadd213ps_avx512f(auVar41,auVar149,auVar40);
    auVar39._16_8_ = uStack_3c70;
    auVar39._0_16_ = local_3c80;
    auVar39._24_8_ = uStack_3c68;
    auVar39._32_8_ = uStack_3c60;
    auVar39._40_8_ = uStack_3c58;
    auVar39._48_8_ = uStack_3c50;
    auVar39._56_8_ = uStack_3c48;
    auVar38._8_4_ = 0.3333333;
    auVar38._12_4_ = 0.3333333;
    auVar38._0_4_ = 0.3333333;
    auVar38._4_4_ = 0.3333333;
    auVar38._16_4_ = 0.3333333;
    auVar38._20_4_ = 0.3333333;
    auVar38._24_4_ = 0.3333333;
    auVar38._28_4_ = 0.3333333;
    auVar38._32_4_ = 0.3333333;
    auVar38._36_4_ = 0.3333333;
    auVar38._40_4_ = 0.3333333;
    auVar38._44_4_ = 0.3333333;
    auVar38._48_4_ = 0.3333333;
    auVar38._52_4_ = 0.3333333;
    auVar38._56_4_ = 0.3333333;
    auVar38._60_4_ = 0.3333333;
    auVar149 = vfmadd213ps_avx512f(auVar39,auVar149,auVar38);
    auVar30._16_8_ = uStack_3c70;
    auVar30._0_16_ = local_3c80;
    auVar30._24_8_ = uStack_3c68;
    auVar30._32_8_ = uStack_3c60;
    auVar30._40_8_ = uStack_3c58;
    auVar30._48_8_ = uStack_3c50;
    auVar30._56_8_ = uStack_3c48;
    auVar149 = vmulps_avx512f(auVar149,auVar30);
    auVar149 = vmulps_avx512f(auVar149,auVar147);
    uStack_3d68 = auVar17._24_8_;
    uStack_3d60 = auVar138._32_8_;
    uStack_3d58 = auVar139._40_8_;
    uStack_3d50 = auVar140._48_8_;
    uStack_3d48 = auVar148._56_8_;
    auVar37._16_8_ = uStack_3d70;
    auVar37._0_16_ = local_3d80;
    auVar37._24_8_ = uStack_3d68;
    auVar37._32_8_ = uStack_3d60;
    auVar37._40_8_ = uStack_3d58;
    auVar37._48_8_ = uStack_3d50;
    auVar37._56_8_ = uStack_3d48;
    auVar36._8_4_ = -0.00021219444;
    auVar36._12_4_ = -0.00021219444;
    auVar36._0_4_ = -0.00021219444;
    auVar36._4_4_ = -0.00021219444;
    auVar36._16_4_ = -0.00021219444;
    auVar36._20_4_ = -0.00021219444;
    auVar36._24_4_ = -0.00021219444;
    auVar36._28_4_ = -0.00021219444;
    auVar36._32_4_ = -0.00021219444;
    auVar36._36_4_ = -0.00021219444;
    auVar36._40_4_ = -0.00021219444;
    auVar36._44_4_ = -0.00021219444;
    auVar36._48_4_ = -0.00021219444;
    auVar36._52_4_ = -0.00021219444;
    auVar36._56_4_ = -0.00021219444;
    auVar36._60_4_ = -0.00021219444;
    auVar148 = vfmadd213ps_avx512f(auVar36,auVar37,auVar149);
    auVar65._8_4_ = 0.5;
    auVar65._12_4_ = 0.5;
    auVar65._0_4_ = 0.5;
    auVar65._4_4_ = 0.5;
    auVar65._16_4_ = 0.5;
    auVar65._20_4_ = 0.5;
    auVar65._24_4_ = 0.5;
    auVar65._28_4_ = 0.5;
    auVar65._32_4_ = 0.5;
    auVar65._36_4_ = 0.5;
    auVar65._40_4_ = 0.5;
    auVar65._44_4_ = 0.5;
    auVar65._48_4_ = 0.5;
    auVar65._52_4_ = 0.5;
    auVar65._56_4_ = 0.5;
    auVar65._60_4_ = 0.5;
    auVar148 = vfnmadd213ps_avx512f(auVar65,auVar147,auVar148);
    auVar27._16_8_ = uStack_3c70;
    auVar27._0_16_ = local_3c80;
    auVar27._24_8_ = uStack_3c68;
    auVar27._32_8_ = uStack_3c60;
    auVar27._40_8_ = uStack_3c58;
    auVar27._48_8_ = uStack_3c50;
    auVar27._56_8_ = uStack_3c48;
    auVar148 = vaddps_avx512f(auVar27,auVar148);
    auVar35._16_8_ = uStack_3d70;
    auVar35._0_16_ = local_3d80;
    auVar35._24_8_ = uStack_3d68;
    auVar35._32_8_ = uStack_3d60;
    auVar35._40_8_ = uStack_3d58;
    auVar35._48_8_ = uStack_3d50;
    auVar35._56_8_ = uStack_3d48;
    auVar34._8_4_ = 0.6933594;
    auVar34._12_4_ = 0.6933594;
    auVar34._0_4_ = 0.6933594;
    auVar34._4_4_ = 0.6933594;
    auVar34._16_4_ = 0.6933594;
    auVar34._20_4_ = 0.6933594;
    auVar34._24_4_ = 0.6933594;
    auVar34._28_4_ = 0.6933594;
    auVar34._32_4_ = 0.6933594;
    auVar34._36_4_ = 0.6933594;
    auVar34._40_4_ = 0.6933594;
    auVar34._44_4_ = 0.6933594;
    auVar34._48_4_ = 0.6933594;
    auVar34._52_4_ = 0.6933594;
    auVar34._56_4_ = 0.6933594;
    auVar34._60_4_ = 0.6933594;
    auVar147 = vfmadd213ps_avx512f(auVar34,auVar35,auVar148);
    auVar148 = vpmovm2d_avx512dq(uVar24 & 0xffff);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar147 = vmovdqa64_avx512f(auVar147);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vpord_avx512f(auVar147,auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmulps_avx512f(*local_45d0,auVar148);
    auVar149._8_4_ = 88.37626;
    auVar149._12_4_ = 88.37626;
    auVar149._0_4_ = 88.37626;
    auVar149._4_4_ = 88.37626;
    auVar149._16_4_ = 88.37626;
    auVar149._20_4_ = 88.37626;
    auVar149._24_4_ = 88.37626;
    auVar149._28_4_ = 88.37626;
    auVar149._32_4_ = 88.37626;
    auVar149._36_4_ = 88.37626;
    auVar149._40_4_ = 88.37626;
    auVar149._44_4_ = 88.37626;
    auVar149._48_4_ = 88.37626;
    auVar149._52_4_ = 88.37626;
    auVar149._56_4_ = 88.37626;
    auVar149._60_4_ = 88.37626;
    auVar148 = vminps_avx512f(auVar148,auVar149);
    auVar147._8_4_ = -88.37626;
    auVar147._12_4_ = -88.37626;
    auVar147._0_4_ = -88.37626;
    auVar147._4_4_ = -88.37626;
    auVar147._16_4_ = -88.37626;
    auVar147._20_4_ = -88.37626;
    auVar147._24_4_ = -88.37626;
    auVar147._28_4_ = -88.37626;
    auVar147._32_4_ = -88.37626;
    auVar147._36_4_ = -88.37626;
    auVar147._40_4_ = -88.37626;
    auVar147._44_4_ = -88.37626;
    auVar147._48_4_ = -88.37626;
    auVar147._52_4_ = -88.37626;
    auVar147._56_4_ = -88.37626;
    auVar147._60_4_ = -88.37626;
    auVar147 = vmaxps_avx512f(auVar148,auVar147);
    auVar62._8_4_ = 1.442695;
    auVar62._12_4_ = 1.442695;
    auVar62._0_4_ = 1.442695;
    auVar62._4_4_ = 1.442695;
    auVar62._16_4_ = 1.442695;
    auVar62._20_4_ = 1.442695;
    auVar62._24_4_ = 1.442695;
    auVar62._28_4_ = 1.442695;
    auVar62._32_4_ = 1.442695;
    auVar62._36_4_ = 1.442695;
    auVar62._40_4_ = 1.442695;
    auVar62._44_4_ = 1.442695;
    auVar62._48_4_ = 1.442695;
    auVar62._52_4_ = 1.442695;
    auVar62._56_4_ = 1.442695;
    auVar62._60_4_ = 1.442695;
    auVar61._8_4_ = 0.5;
    auVar61._12_4_ = 0.5;
    auVar61._0_4_ = 0.5;
    auVar61._4_4_ = 0.5;
    auVar61._16_4_ = 0.5;
    auVar61._20_4_ = 0.5;
    auVar61._24_4_ = 0.5;
    auVar61._28_4_ = 0.5;
    auVar61._32_4_ = 0.5;
    auVar61._36_4_ = 0.5;
    auVar61._40_4_ = 0.5;
    auVar61._44_4_ = 0.5;
    auVar61._48_4_ = 0.5;
    auVar61._52_4_ = 0.5;
    auVar61._56_4_ = 0.5;
    auVar61._60_4_ = 0.5;
    auVar148 = vfmadd213ps_avx512f(auVar62,auVar147,auVar61);
    auVar149 = vrndscaleps_avx512f(auVar148,1);
    uVar25 = vcmpps_avx512f(auVar148,auVar149,1);
    uVar26 = (ushort)uVar25;
    auVar64._8_4_ = 1.0;
    auVar64._12_4_ = 1.0;
    auVar64._0_4_ = 1.0;
    auVar64._4_4_ = 1.0;
    auVar64._16_4_ = 1.0;
    auVar64._20_4_ = 1.0;
    auVar64._24_4_ = 1.0;
    auVar64._28_4_ = 1.0;
    auVar64._32_4_ = 1.0;
    auVar64._36_4_ = 1.0;
    auVar64._40_4_ = 1.0;
    auVar64._44_4_ = 1.0;
    auVar64._48_4_ = 1.0;
    auVar64._52_4_ = 1.0;
    auVar64._56_4_ = 1.0;
    auVar64._60_4_ = 1.0;
    local_2940 = auVar149._0_4_;
    iStack_293c = auVar149._4_4_;
    iStack_2938 = auVar149._8_4_;
    iStack_2934 = auVar149._12_4_;
    iStack_2930 = auVar149._16_4_;
    iStack_292c = auVar149._20_4_;
    iStack_2928 = auVar149._24_4_;
    iStack_2924 = auVar149._28_4_;
    iStack_2920 = auVar149._32_4_;
    iStack_291c = auVar149._36_4_;
    iStack_2918 = auVar149._40_4_;
    iStack_2914 = auVar149._44_4_;
    iStack_2910 = auVar149._48_4_;
    iStack_290c = auVar149._52_4_;
    iStack_2908 = auVar149._56_4_;
    iStack_2904 = auVar149._60_4_;
    auVar148 = vsubps_avx512f(auVar149,auVar64);
    bVar2 = (bool)((byte)uVar25 & 1);
    bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
    bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
    bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
    bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
    bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
    bVar10 = (byte)((ulong)uVar25 >> 8);
    bVar11 = (bool)(bVar10 >> 1 & 1);
    bVar12 = (bool)(bVar10 >> 2 & 1);
    bVar13 = (bool)(bVar10 >> 3 & 1);
    bVar14 = (bool)(bVar10 >> 4 & 1);
    bVar15 = (bool)(bVar10 >> 5 & 1);
    bVar16 = (bool)(bVar10 >> 6 & 1);
    local_41c0._4_4_ = (uint)bVar3 * auVar148._4_4_ | (uint)!bVar3 * iStack_293c;
    local_41c0._0_4_ = (uint)bVar2 * auVar148._0_4_ | (uint)!bVar2 * local_2940;
    local_41c0._8_4_ = (uint)bVar4 * auVar148._8_4_ | (uint)!bVar4 * iStack_2938;
    local_41c0._12_4_ = (uint)bVar5 * auVar148._12_4_ | (uint)!bVar5 * iStack_2934;
    uStack_41b0._0_4_ = (uint)bVar6 * auVar148._16_4_ | (uint)!bVar6 * iStack_2930;
    uStack_41b0._4_4_ = (uint)bVar7 * auVar148._20_4_ | (uint)!bVar7 * iStack_292c;
    uStack_41a8._0_4_ = (uint)bVar8 * auVar148._24_4_ | (uint)!bVar8 * iStack_2928;
    uStack_41a8._4_4_ = (uint)bVar9 * auVar148._28_4_ | (uint)!bVar9 * iStack_2924;
    auVar17 = _local_41c0;
    uStack_41a0._0_4_ =
         (uint)(bVar10 & 1) * auVar148._32_4_ | (uint)!(bool)(bVar10 & 1) * iStack_2920;
    uStack_41a0._4_4_ = (uint)bVar11 * auVar148._36_4_ | (uint)!bVar11 * iStack_291c;
    auVar138 = _local_41c0;
    uStack_4198._0_4_ = (uint)bVar12 * auVar148._40_4_ | (uint)!bVar12 * iStack_2918;
    uStack_4198._4_4_ = (uint)bVar13 * auVar148._44_4_ | (uint)!bVar13 * iStack_2914;
    auVar139 = _local_41c0;
    uStack_4190._0_4_ = (uint)bVar14 * auVar148._48_4_ | (uint)!bVar14 * iStack_2910;
    uStack_4190._4_4_ = (uint)bVar15 * auVar148._52_4_ | (uint)!bVar15 * iStack_290c;
    auVar140 = _local_41c0;
    uStack_4188._0_4_ = (uint)bVar16 * auVar148._56_4_ | (uint)!bVar16 * iStack_2908;
    uStack_4188._4_4_ =
         (uint)(bVar10 >> 7) * auVar148._60_4_ | (uint)!(bool)(bVar10 >> 7) * iStack_2904;
    auVar148 = _local_41c0;
    uStack_41a8 = auVar17._24_8_;
    uStack_41a0 = auVar138._32_8_;
    uStack_4198 = auVar139._40_8_;
    uStack_4190 = auVar140._48_8_;
    uStack_4188 = auVar148._56_8_;
    auVar69._16_8_ = uStack_41b0;
    auVar69._0_16_ = local_41c0;
    auVar69._24_8_ = uStack_41a8;
    auVar69._32_8_ = uStack_41a0;
    auVar69._40_8_ = uStack_4198;
    auVar69._48_8_ = uStack_4190;
    auVar69._56_8_ = uStack_4188;
    auVar68._8_4_ = 0.6933594;
    auVar68._12_4_ = 0.6933594;
    auVar68._0_4_ = 0.6933594;
    auVar68._4_4_ = 0.6933594;
    auVar68._16_4_ = 0.6933594;
    auVar68._20_4_ = 0.6933594;
    auVar68._24_4_ = 0.6933594;
    auVar68._28_4_ = 0.6933594;
    auVar68._32_4_ = 0.6933594;
    auVar68._36_4_ = 0.6933594;
    auVar68._40_4_ = 0.6933594;
    auVar68._44_4_ = 0.6933594;
    auVar68._48_4_ = 0.6933594;
    auVar68._52_4_ = 0.6933594;
    auVar68._56_4_ = 0.6933594;
    auVar68._60_4_ = 0.6933594;
    auVar148 = vfnmadd213ps_avx512f(auVar68,auVar69,auVar147);
    auVar67._16_8_ = uStack_41b0;
    auVar67._0_16_ = local_41c0;
    auVar67._24_8_ = uStack_41a8;
    auVar67._32_8_ = uStack_41a0;
    auVar67._40_8_ = uStack_4198;
    auVar67._48_8_ = uStack_4190;
    auVar67._56_8_ = uStack_4188;
    auVar66._8_4_ = -0.00021219444;
    auVar66._12_4_ = -0.00021219444;
    auVar66._0_4_ = -0.00021219444;
    auVar66._4_4_ = -0.00021219444;
    auVar66._16_4_ = -0.00021219444;
    auVar66._20_4_ = -0.00021219444;
    auVar66._24_4_ = -0.00021219444;
    auVar66._28_4_ = -0.00021219444;
    auVar66._32_4_ = -0.00021219444;
    auVar66._36_4_ = -0.00021219444;
    auVar66._40_4_ = -0.00021219444;
    auVar66._44_4_ = -0.00021219444;
    auVar66._48_4_ = -0.00021219444;
    auVar66._52_4_ = -0.00021219444;
    auVar66._56_4_ = -0.00021219444;
    auVar66._60_4_ = -0.00021219444;
    auVar148 = vfnmadd213ps_avx512f(auVar66,auVar67,auVar148);
    auVar147 = vmulps_avx512f(auVar148,auVar148);
    uStack_42b8._0_4_ = 0.00019875691;
    uStack_42b8._4_4_ = 0.00019875691;
    local_42c0._0_4_ = 0.00019875691;
    local_42c0._4_4_ = 0.00019875691;
    auVar60._16_4_ = 0.00019875691;
    auVar60._20_4_ = 0.00019875691;
    auVar60._0_16_ = _local_42c0;
    auVar60._24_4_ = 0.00019875691;
    auVar60._28_4_ = 0.00019875691;
    auVar60._32_4_ = 0.00019875691;
    auVar60._36_4_ = 0.00019875691;
    auVar60._40_4_ = 0.00019875691;
    auVar60._44_4_ = 0.00019875691;
    auVar60._48_4_ = 0.00019875691;
    auVar60._52_4_ = 0.00019875691;
    auVar60._56_4_ = 0.00019875691;
    auVar60._60_4_ = 0.00019875691;
    auVar59._8_4_ = 0.0013981999;
    auVar59._12_4_ = 0.0013981999;
    auVar59._0_4_ = 0.0013981999;
    auVar59._4_4_ = 0.0013981999;
    auVar59._16_4_ = 0.0013981999;
    auVar59._20_4_ = 0.0013981999;
    auVar59._24_4_ = 0.0013981999;
    auVar59._28_4_ = 0.0013981999;
    auVar59._32_4_ = 0.0013981999;
    auVar59._36_4_ = 0.0013981999;
    auVar59._40_4_ = 0.0013981999;
    auVar59._44_4_ = 0.0013981999;
    auVar59._48_4_ = 0.0013981999;
    auVar59._52_4_ = 0.0013981999;
    auVar59._56_4_ = 0.0013981999;
    auVar59._60_4_ = 0.0013981999;
    auVar149 = vfmadd213ps_avx512f(auVar148,auVar60,auVar59);
    auVar58._8_4_ = 0.008333452;
    auVar58._12_4_ = 0.008333452;
    auVar58._0_4_ = 0.008333452;
    auVar58._4_4_ = 0.008333452;
    auVar58._16_4_ = 0.008333452;
    auVar58._20_4_ = 0.008333452;
    auVar58._24_4_ = 0.008333452;
    auVar58._28_4_ = 0.008333452;
    auVar58._32_4_ = 0.008333452;
    auVar58._36_4_ = 0.008333452;
    auVar58._40_4_ = 0.008333452;
    auVar58._44_4_ = 0.008333452;
    auVar58._48_4_ = 0.008333452;
    auVar58._52_4_ = 0.008333452;
    auVar58._56_4_ = 0.008333452;
    auVar58._60_4_ = 0.008333452;
    auVar149 = vfmadd213ps_avx512f(auVar148,auVar149,auVar58);
    auVar57._8_4_ = 0.041665796;
    auVar57._12_4_ = 0.041665796;
    auVar57._0_4_ = 0.041665796;
    auVar57._4_4_ = 0.041665796;
    auVar57._16_4_ = 0.041665796;
    auVar57._20_4_ = 0.041665796;
    auVar57._24_4_ = 0.041665796;
    auVar57._28_4_ = 0.041665796;
    auVar57._32_4_ = 0.041665796;
    auVar57._36_4_ = 0.041665796;
    auVar57._40_4_ = 0.041665796;
    auVar57._44_4_ = 0.041665796;
    auVar57._48_4_ = 0.041665796;
    auVar57._52_4_ = 0.041665796;
    auVar57._56_4_ = 0.041665796;
    auVar57._60_4_ = 0.041665796;
    auVar149 = vfmadd213ps_avx512f(auVar148,auVar149,auVar57);
    auVar56._8_4_ = 0.16666666;
    auVar56._12_4_ = 0.16666666;
    auVar56._0_4_ = 0.16666666;
    auVar56._4_4_ = 0.16666666;
    auVar56._16_4_ = 0.16666666;
    auVar56._20_4_ = 0.16666666;
    auVar56._24_4_ = 0.16666666;
    auVar56._28_4_ = 0.16666666;
    auVar56._32_4_ = 0.16666666;
    auVar56._36_4_ = 0.16666666;
    auVar56._40_4_ = 0.16666666;
    auVar56._44_4_ = 0.16666666;
    auVar56._48_4_ = 0.16666666;
    auVar56._52_4_ = 0.16666666;
    auVar56._56_4_ = 0.16666666;
    auVar56._60_4_ = 0.16666666;
    auVar149 = vfmadd213ps_avx512f(auVar148,auVar149,auVar56);
    auVar55._8_4_ = 0.5;
    auVar55._12_4_ = 0.5;
    auVar55._0_4_ = 0.5;
    auVar55._4_4_ = 0.5;
    auVar55._16_4_ = 0.5;
    auVar55._20_4_ = 0.5;
    auVar55._24_4_ = 0.5;
    auVar55._28_4_ = 0.5;
    auVar55._32_4_ = 0.5;
    auVar55._36_4_ = 0.5;
    auVar55._40_4_ = 0.5;
    auVar55._44_4_ = 0.5;
    auVar55._48_4_ = 0.5;
    auVar55._52_4_ = 0.5;
    auVar55._56_4_ = 0.5;
    auVar55._60_4_ = 0.5;
    auVar149 = vfmadd213ps_avx512f(auVar148,auVar149,auVar55);
    auVar147 = vfmadd213ps_avx512f(auVar147,auVar149,auVar148);
    auVar148._8_4_ = 1.0;
    auVar148._12_4_ = 1.0;
    auVar148._0_4_ = 1.0;
    auVar148._4_4_ = 1.0;
    auVar148._16_4_ = 1.0;
    auVar148._20_4_ = 1.0;
    auVar148._24_4_ = 1.0;
    auVar148._28_4_ = 1.0;
    auVar148._32_4_ = 1.0;
    auVar148._36_4_ = 1.0;
    auVar148._40_4_ = 1.0;
    auVar148._44_4_ = 1.0;
    auVar148._48_4_ = 1.0;
    auVar148._52_4_ = 1.0;
    auVar148._56_4_ = 1.0;
    auVar148._60_4_ = 1.0;
    auVar149 = vaddps_avx512f(auVar147,auVar148);
    auVar70._16_8_ = uStack_41b0;
    auVar70._0_16_ = local_41c0;
    auVar70._24_8_ = uStack_41a8;
    auVar70._32_8_ = uStack_41a0;
    auVar70._40_8_ = uStack_4198;
    auVar70._48_8_ = uStack_4190;
    auVar70._56_8_ = uStack_4188;
    auVar148 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    vmovdqa64_avx512f(auVar148);
    auVar148 = vcvttps2dq_avx512f(auVar70);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar147 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar147 = vmovdqa64_avx512f(auVar147);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar147 = vmovdqa64_avx512f(auVar147);
    auVar148 = vpaddd_avx512f(auVar148,auVar147);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vpslld_avx512f(auVar148,ZEXT416(0x17));
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmovdqa64_avx512f(auVar148);
    auVar148 = vmulps_avx512f(auVar149,auVar148);
    local_42c0 = auVar148._0_8_;
    uStack_42b8 = auVar148._8_8_;
    uStack_42b0 = auVar148._16_8_;
    uStack_42a8 = auVar148._24_8_;
    uStack_42a0 = auVar148._32_8_;
    uStack_4298 = auVar148._40_8_;
    uStack_4290 = auVar148._48_8_;
    uStack_4288 = auVar148._56_8_;
    *local_45e0 = local_42c0;
    local_45e0[1] = uStack_42b8;
    local_45e0[2] = uStack_42b0;
    local_45e0[3] = uStack_42a8;
    local_45e0[4] = uStack_42a0;
    local_45e0[5] = uStack_4298;
    local_45e0[6] = uStack_4290;
    local_45e0[7] = uStack_4288;
    local_45d0 = local_45d0 + 1;
    local_45e0 = local_45e0 + 8;
  }
  uVar1 = *in_RSI;
  auVar18 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(uVar1),0x20);
  auVar18 = vinsertps_avx(auVar18,ZEXT416(uVar1),0x30);
  auVar19 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(uVar1),0x20);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(uVar1),0x30);
  uStack_4450 = auVar18._0_8_;
  uStack_4448 = auVar18._8_8_;
  for (; local_45f4 + 7 < iVar145; local_45f4 = local_45f4 + 8) {
    auVar135._16_8_ = uStack_4450;
    auVar135._0_16_ = auVar19;
    auVar135._24_8_ = uStack_4448;
    auVar134._16_8_ = uStack_4450;
    auVar134._0_16_ = auVar19;
    auVar134._24_8_ = uStack_4448;
    auVar17 = vcmpps_avx(auVar134,ZEXT1632(ZEXT816(0)),2);
    auVar23._8_4_ = 0x800000;
    auVar23._0_8_ = 0x80000000800000;
    auVar23._12_4_ = 0x800000;
    auVar23._16_4_ = 0x800000;
    auVar23._20_4_ = 0x800000;
    auVar23._24_4_ = 0x800000;
    auVar23._28_4_ = 0x800000;
    auVar151 = vmaxps_avx(auVar135,auVar23);
    auVar23 = vpsrld_avx2(auVar151,ZEXT416(0x17));
    auVar76._8_4_ = 0x807fffff;
    auVar76._0_8_ = 0x807fffff807fffff;
    auVar76._12_4_ = 0x807fffff;
    auVar76._16_4_ = 0x807fffff;
    auVar76._20_4_ = 0x807fffff;
    auVar76._24_4_ = 0x807fffff;
    auVar76._28_4_ = 0x807fffff;
    auVar151 = vpand_avx2(auVar151,auVar76);
    auVar100._8_4_ = 0x3f000000;
    auVar100._0_8_ = 0x3f0000003f000000;
    auVar100._12_4_ = 0x3f000000;
    auVar100._16_4_ = 0x3f000000;
    auVar100._20_4_ = 0x3f000000;
    auVar100._24_4_ = 0x3f000000;
    auVar100._28_4_ = 0x3f000000;
    auVar22 = vpor_avx2(auVar151,auVar100);
    auVar101._8_8_ = 0x7f0000007f;
    auVar101._0_8_ = 0x7f0000007f;
    auVar101._16_8_ = 0x7f0000007f;
    auVar101._24_8_ = 0x7f0000007f;
    auVar151 = vpsubd_avx2(auVar23,auVar101);
    auVar151 = vcvtdq2ps_avx(auVar151);
    local_1ac0 = auVar151._0_4_;
    fStack_1abc = auVar151._4_4_;
    fStack_1ab8 = auVar151._8_4_;
    fStack_1ab4 = auVar151._12_4_;
    fStack_1ab0 = auVar151._16_4_;
    fStack_1aac = auVar151._20_4_;
    fStack_1aa8 = auVar151._24_4_;
    fStack_1aa4 = auVar151._28_4_;
    local_1c00._4_4_ = fStack_1abc + 1.0;
    local_1c00._0_4_ = local_1ac0 + 1.0;
    fStack_1bf8 = fStack_1ab8 + 1.0;
    fStack_1bf4 = fStack_1ab4 + 1.0;
    uStack_1bf0._0_4_ = fStack_1ab0 + 1.0;
    uStack_1bf0._4_4_ = fStack_1aac + 1.0;
    uStack_1be8._0_4_ = fStack_1aa8 + 1.0;
    uStack_1be8._4_4_ = fStack_1aa4 + 1.0;
    auVar73 = _local_1c00;
    auVar155._8_4_ = 0x3f3504f3;
    auVar155._0_8_ = 0x3f3504f33f3504f3;
    auVar155._12_4_ = 0x3f3504f3;
    auVar155._16_4_ = 0x3f3504f3;
    auVar155._20_4_ = 0x3f3504f3;
    auVar155._24_4_ = 0x3f3504f3;
    auVar155._28_4_ = 0x3f3504f3;
    auVar151 = vcmpps_avx(auVar22,auVar155,1);
    auVar23 = vpand_avx2(auVar22,auVar151);
    auVar74._8_8_ = 0x3f8000003f800000;
    auVar74._0_8_ = 0x3f8000003f800000;
    auVar74._16_8_ = 0x3f8000003f800000;
    auVar74._24_8_ = 0x3f8000003f800000;
    auVar22 = vsubps_avx(auVar22,auVar74);
    uStack_1be8 = auVar73._24_8_;
    auVar75._8_8_ = 0x3f8000003f800000;
    auVar75._0_8_ = 0x3f8000003f800000;
    auVar75._16_8_ = 0x3f8000003f800000;
    auVar75._24_8_ = 0x3f8000003f800000;
    auVar151 = vpand_avx2(auVar75,auVar151);
    auVar73._16_8_ = uStack_1bf0;
    auVar73._0_16_ = _local_1c00;
    auVar73._24_8_ = uStack_1be8;
    auVar151 = vsubps_avx(auVar73,auVar151);
    local_1b00 = auVar22._0_4_;
    fStack_1afc = auVar22._4_4_;
    fStack_1af8 = auVar22._8_4_;
    fStack_1af4 = auVar22._12_4_;
    fStack_1af0 = auVar22._16_4_;
    fStack_1aec = auVar22._20_4_;
    fStack_1ae8 = auVar22._24_4_;
    fStack_1ae4 = auVar22._28_4_;
    local_1b20 = auVar23._0_4_;
    fStack_1b1c = auVar23._4_4_;
    fStack_1b18 = auVar23._8_4_;
    fStack_1b14 = auVar23._12_4_;
    fStack_1b10 = auVar23._16_4_;
    fStack_1b0c = auVar23._20_4_;
    fStack_1b08 = auVar23._24_4_;
    fStack_1b04 = auVar23._28_4_;
    local_1b80._0_4_ = local_1b00 + local_1b20;
    local_1b80._4_4_ = fStack_1afc + fStack_1b1c;
    fStack_1b78 = fStack_1af8 + fStack_1b18;
    fStack_1b74 = fStack_1af4 + fStack_1b14;
    fStack_1b70 = fStack_1af0 + fStack_1b10;
    fStack_1b6c = fStack_1aec + fStack_1b0c;
    fStack_1b68 = fStack_1ae8 + fStack_1b08;
    fStack_1b64 = fStack_1ae4 + fStack_1b04;
    fStack_1c78 = 0.070376836;
    local_1c80 = (undefined1  [8])0x3d9021bb3d9021bb;
    fStack_1c74 = 0.070376836;
    fStack_1c70 = 0.070376836;
    fStack_1c6c = 0.070376836;
    fStack_1c68 = 0.070376836;
    uStack_1c64 = 0x3d9021bb;
    auVar85._8_4_ = -0.1151461;
    auVar85._12_4_ = -0.1151461;
    auVar85._0_4_ = -0.1151461;
    auVar85._4_4_ = -0.1151461;
    auVar85._16_4_ = -0.1151461;
    auVar85._20_4_ = -0.1151461;
    auVar85._24_4_ = -0.1151461;
    auVar85._28_4_ = -0.1151461;
    auVar18 = vfmadd213ps_fma(_local_1b80,_local_1c80,auVar85);
    auVar86._8_4_ = 0.116769984;
    auVar86._12_4_ = 0.116769984;
    auVar86._0_4_ = 0.116769984;
    auVar86._4_4_ = 0.116769984;
    auVar86._16_4_ = 0.116769984;
    auVar86._20_4_ = 0.116769984;
    auVar86._24_4_ = 0.116769984;
    auVar86._28_4_ = 0.116769984;
    auVar18 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar18),auVar86);
    auVar87._8_4_ = -0.12420141;
    auVar87._12_4_ = -0.12420141;
    auVar87._0_4_ = -0.12420141;
    auVar87._4_4_ = -0.12420141;
    auVar87._16_4_ = -0.12420141;
    auVar87._20_4_ = -0.12420141;
    auVar87._24_4_ = -0.12420141;
    auVar87._28_4_ = -0.12420141;
    auVar18 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar18),auVar87);
    auVar88._8_4_ = 0.14249323;
    auVar88._12_4_ = 0.14249323;
    auVar88._0_4_ = 0.14249323;
    auVar88._4_4_ = 0.14249323;
    auVar88._16_4_ = 0.14249323;
    auVar88._20_4_ = 0.14249323;
    auVar88._24_4_ = 0.14249323;
    auVar88._28_4_ = 0.14249323;
    auVar18 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar18),auVar88);
    auVar89._8_4_ = -0.16668057;
    auVar89._12_4_ = -0.16668057;
    auVar89._0_4_ = -0.16668057;
    auVar89._4_4_ = -0.16668057;
    auVar89._16_4_ = -0.16668057;
    auVar89._20_4_ = -0.16668057;
    auVar89._24_4_ = -0.16668057;
    auVar89._28_4_ = -0.16668057;
    auVar18 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar18),auVar89);
    auVar90._8_4_ = 0.20000714;
    auVar90._12_4_ = 0.20000714;
    auVar90._0_4_ = 0.20000714;
    auVar90._4_4_ = 0.20000714;
    auVar90._16_4_ = 0.20000714;
    auVar90._20_4_ = 0.20000714;
    auVar90._24_4_ = 0.20000714;
    auVar90._28_4_ = 0.20000714;
    auVar18 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar18),auVar90);
    auVar91._8_4_ = -0.24999994;
    auVar91._12_4_ = -0.24999994;
    auVar91._0_4_ = -0.24999994;
    auVar91._4_4_ = -0.24999994;
    auVar91._16_4_ = -0.24999994;
    auVar91._20_4_ = -0.24999994;
    auVar91._24_4_ = -0.24999994;
    auVar91._28_4_ = -0.24999994;
    auVar18 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar18),auVar91);
    auVar92._8_4_ = 0.3333333;
    auVar92._12_4_ = 0.3333333;
    auVar92._0_4_ = 0.3333333;
    auVar92._4_4_ = 0.3333333;
    auVar92._16_4_ = 0.3333333;
    auVar92._20_4_ = 0.3333333;
    auVar92._24_4_ = 0.3333333;
    auVar92._28_4_ = 0.3333333;
    auVar18 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar18),auVar92);
    local_19c0 = auVar18._0_4_;
    fStack_19bc = auVar18._4_4_;
    fStack_19b8 = auVar18._8_4_;
    fStack_19b4 = auVar18._12_4_;
    local_1c80._4_4_ =
         fStack_19bc * (float)local_1b80._4_4_ * (float)local_1b80._4_4_ * (float)local_1b80._4_4_;
    local_1c80._0_4_ =
         local_19c0 * (float)local_1b80._0_4_ * (float)local_1b80._0_4_ * (float)local_1b80._0_4_;
    fStack_1c78 = fStack_19b8 * fStack_1b78 * fStack_1b78 * fStack_1b78;
    fStack_1c74 = fStack_19b4 * fStack_1b74 * fStack_1b74 * fStack_1b74;
    fStack_1c70 = fStack_1b70 * 0.0 * fStack_1b70 * fStack_1b70;
    fStack_1c6c = fStack_1b6c * 0.0 * fStack_1b6c * fStack_1b6c;
    fStack_1c68 = fStack_1b68 * 0.0 * fStack_1b68 * fStack_1b68;
    uStack_1c64 = 0;
    auVar93._8_4_ = -0.00021219444;
    auVar93._12_4_ = -0.00021219444;
    auVar93._0_4_ = -0.00021219444;
    auVar93._4_4_ = -0.00021219444;
    auVar93._16_4_ = -0.00021219444;
    auVar93._20_4_ = -0.00021219444;
    auVar93._24_4_ = -0.00021219444;
    auVar93._28_4_ = -0.00021219444;
    auVar18 = vfmadd213ps_fma(auVar93,auVar151,_local_1c80);
    auVar136._4_4_ = (float)local_1b80._4_4_ * (float)local_1b80._4_4_;
    auVar136._0_4_ = (float)local_1b80._0_4_ * (float)local_1b80._0_4_;
    auVar136._8_4_ = fStack_1b78 * fStack_1b78;
    auVar136._12_4_ = fStack_1b74 * fStack_1b74;
    auVar136._16_4_ = fStack_1b70 * fStack_1b70;
    auVar136._20_4_ = fStack_1b6c * fStack_1b6c;
    auVar136._24_4_ = fStack_1b68 * fStack_1b68;
    auVar136._28_4_ = fStack_1b64;
    auVar97._8_4_ = 0.5;
    auVar97._12_4_ = 0.5;
    auVar97._0_4_ = 0.5;
    auVar97._4_4_ = 0.5;
    auVar97._16_4_ = 0.5;
    auVar97._20_4_ = 0.5;
    auVar97._24_4_ = 0.5;
    auVar97._28_4_ = 0.5;
    auVar18 = vfnmadd213ps_fma(auVar97,auVar136,ZEXT1632(auVar18));
    local_1b60 = auVar18._0_4_;
    fStack_1b5c = auVar18._4_4_;
    fStack_1b58 = auVar18._8_4_;
    fStack_1b54 = auVar18._12_4_;
    local_1b80._4_4_ = (float)local_1b80._4_4_ + fStack_1b5c;
    local_1b80._0_4_ = (float)local_1b80._0_4_ + local_1b60;
    fStack_1b78 = fStack_1b78 + fStack_1b58;
    fStack_1b74 = fStack_1b74 + fStack_1b54;
    fStack_1b70 = fStack_1b70 + 0.0;
    fStack_1b6c = fStack_1b6c + 0.0;
    fStack_1b68 = fStack_1b68 + 0.0;
    fStack_1b64 = fStack_1b64 + 0.0;
    auVar94._8_4_ = 0.6933594;
    auVar94._12_4_ = 0.6933594;
    auVar94._0_4_ = 0.6933594;
    auVar94._4_4_ = 0.6933594;
    auVar94._16_4_ = 0.6933594;
    auVar94._20_4_ = 0.6933594;
    auVar94._24_4_ = 0.6933594;
    auVar94._28_4_ = 0.6933594;
    auVar18 = vfmadd213ps_fma(auVar94,auVar151,_local_1b80);
    auVar17 = vpor_avx2(ZEXT1632(auVar18),auVar17);
    local_1f20 = (float)*(undefined8 *)*local_45d0;
    fStack_1f1c = (float)((ulong)*(undefined8 *)*local_45d0 >> 0x20);
    fStack_1f18 = (float)*(undefined8 *)(*local_45d0 + 8);
    fStack_1f14 = (float)((ulong)*(undefined8 *)(*local_45d0 + 8) >> 0x20);
    fStack_1f10 = (float)*(undefined8 *)(*local_45d0 + 0x10);
    fStack_1f0c = (float)((ulong)*(undefined8 *)(*local_45d0 + 0x10) >> 0x20);
    fStack_1f08 = (float)*(undefined8 *)(*local_45d0 + 0x18);
    uStack_1f04 = (undefined4)((ulong)*(undefined8 *)(*local_45d0 + 0x18) >> 0x20);
    local_1f40 = auVar17._0_4_;
    fStack_1f3c = auVar17._4_4_;
    fStack_1f38 = auVar17._8_4_;
    fStack_1f34 = auVar17._12_4_;
    fStack_1f30 = auVar17._16_4_;
    fStack_1f2c = auVar17._20_4_;
    fStack_1f28 = auVar17._24_4_;
    local_1e20._4_4_ = fStack_1f1c * fStack_1f3c;
    local_1e20._0_4_ = local_1f20 * local_1f40;
    fStack_1e18 = fStack_1f18 * fStack_1f38;
    fStack_1e14 = fStack_1f14 * fStack_1f34;
    uStack_1e10._0_4_ = fStack_1f10 * fStack_1f30;
    uStack_1e10._4_4_ = fStack_1f0c * fStack_1f2c;
    uStack_1e08._0_4_ = fStack_1f08 * fStack_1f28;
    uStack_1e08._4_4_ = uStack_1f04;
    auVar17 = _local_1e20;
    uStack_1e08 = auVar17._24_8_;
    auVar22._16_8_ = uStack_1e10;
    auVar22._0_16_ = _local_1e20;
    auVar22._24_8_ = uStack_1e08;
    auVar17._8_4_ = 0x42b0c0a5;
    auVar17._0_8_ = 0x42b0c0a542b0c0a5;
    auVar17._12_4_ = 0x42b0c0a5;
    auVar17._16_4_ = 0x42b0c0a5;
    auVar17._20_4_ = 0x42b0c0a5;
    auVar17._24_4_ = 0x42b0c0a5;
    auVar17._28_4_ = 0x42b0c0a5;
    auVar17 = vminps_avx(auVar22,auVar17);
    auVar151._8_4_ = 0xc2b0c0a5;
    auVar151._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar151._12_4_ = 0xc2b0c0a5;
    auVar151._16_4_ = 0xc2b0c0a5;
    auVar151._20_4_ = 0xc2b0c0a5;
    auVar151._24_4_ = 0xc2b0c0a5;
    auVar151._28_4_ = 0xc2b0c0a5;
    auVar151 = vmaxps_avx(auVar17,auVar151);
    auVar79._8_4_ = 1.442695;
    auVar79._12_4_ = 1.442695;
    auVar79._0_4_ = 1.442695;
    auVar79._4_4_ = 1.442695;
    auVar79._16_4_ = 1.442695;
    auVar79._20_4_ = 1.442695;
    auVar79._24_4_ = 1.442695;
    auVar79._28_4_ = 1.442695;
    auVar78._8_4_ = 0.5;
    auVar78._12_4_ = 0.5;
    auVar78._0_4_ = 0.5;
    auVar78._4_4_ = 0.5;
    auVar78._16_4_ = 0.5;
    auVar78._20_4_ = 0.5;
    auVar78._24_4_ = 0.5;
    auVar78._28_4_ = 0.5;
    auVar18 = vfmadd213ps_fma(auVar79,auVar151,auVar78);
    auVar22 = vroundps_avx(ZEXT1632(auVar18),1);
    auVar17 = vcmpps_avx(ZEXT1632(auVar18),auVar22,1);
    auVar77._8_8_ = 0x3f8000003f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    auVar77._16_8_ = 0x3f8000003f800000;
    auVar77._24_8_ = 0x3f8000003f800000;
    auVar17 = vpand_avx2(auVar17,auVar77);
    auVar17 = vsubps_avx(auVar22,auVar17);
    auVar95._8_4_ = 0.6933594;
    auVar95._12_4_ = 0.6933594;
    auVar95._0_4_ = 0.6933594;
    auVar95._4_4_ = 0.6933594;
    auVar95._16_4_ = 0.6933594;
    auVar95._20_4_ = 0.6933594;
    auVar95._24_4_ = 0.6933594;
    auVar95._28_4_ = 0.6933594;
    auVar18 = vfnmadd213ps_fma(auVar95,auVar17,auVar151);
    auVar96._8_4_ = -0.00021219444;
    auVar96._12_4_ = -0.00021219444;
    auVar96._0_4_ = -0.00021219444;
    auVar96._4_4_ = -0.00021219444;
    auVar96._16_4_ = -0.00021219444;
    auVar96._20_4_ = -0.00021219444;
    auVar96._24_4_ = -0.00021219444;
    auVar96._28_4_ = -0.00021219444;
    auVar18 = vfnmadd213ps_fma(auVar96,auVar17,ZEXT1632(auVar18));
    auVar151 = ZEXT1632(auVar18);
    local_1d20 = auVar18._0_4_;
    fStack_1d1c = auVar18._4_4_;
    fStack_1d18 = auVar18._8_4_;
    fStack_1d14 = auVar18._12_4_;
    _local_1e40 = ZEXT1632(CONCAT412(fStack_1d14 * fStack_1d14,
                                     CONCAT48(fStack_1d18 * fStack_1d18,
                                              CONCAT44(fStack_1d1c * fStack_1d1c,
                                                       local_1d20 * local_1d20))));
    uStack_1ed8._0_4_ = 0x39506967;
    local_1ee0 = (undefined1  [8])0x3950696739506967;
    uStack_1ed8._4_4_ = 0x39506967;
    uStack_1ed0._0_4_ = 0x39506967;
    uStack_1ed0._4_4_ = 0x39506967;
    uStack_1ec8._0_4_ = 0x39506967;
    uStack_1ec8._4_4_ = 0x39506967;
    auVar80._8_4_ = 0.0013981999;
    auVar80._12_4_ = 0.0013981999;
    auVar80._0_4_ = 0.0013981999;
    auVar80._4_4_ = 0.0013981999;
    auVar80._16_4_ = 0.0013981999;
    auVar80._20_4_ = 0.0013981999;
    auVar80._24_4_ = 0.0013981999;
    auVar80._28_4_ = 0.0013981999;
    auVar18 = vfmadd213ps_fma(auVar151,_local_1ee0,auVar80);
    auVar81._8_4_ = 0.008333452;
    auVar81._12_4_ = 0.008333452;
    auVar81._0_4_ = 0.008333452;
    auVar81._4_4_ = 0.008333452;
    auVar81._16_4_ = 0.008333452;
    auVar81._20_4_ = 0.008333452;
    auVar81._24_4_ = 0.008333452;
    auVar81._28_4_ = 0.008333452;
    auVar18 = vfmadd213ps_fma(auVar151,ZEXT1632(auVar18),auVar81);
    auVar82._8_4_ = 0.041665796;
    auVar82._12_4_ = 0.041665796;
    auVar82._0_4_ = 0.041665796;
    auVar82._4_4_ = 0.041665796;
    auVar82._16_4_ = 0.041665796;
    auVar82._20_4_ = 0.041665796;
    auVar82._24_4_ = 0.041665796;
    auVar82._28_4_ = 0.041665796;
    auVar18 = vfmadd213ps_fma(auVar151,ZEXT1632(auVar18),auVar82);
    auVar83._8_4_ = 0.16666666;
    auVar83._12_4_ = 0.16666666;
    auVar83._0_4_ = 0.16666666;
    auVar83._4_4_ = 0.16666666;
    auVar83._16_4_ = 0.16666666;
    auVar83._20_4_ = 0.16666666;
    auVar83._24_4_ = 0.16666666;
    auVar83._28_4_ = 0.16666666;
    auVar18 = vfmadd213ps_fma(auVar151,ZEXT1632(auVar18),auVar83);
    auVar84._8_4_ = 0.5;
    auVar84._12_4_ = 0.5;
    auVar84._0_4_ = 0.5;
    auVar84._4_4_ = 0.5;
    auVar84._16_4_ = 0.5;
    auVar84._20_4_ = 0.5;
    auVar84._24_4_ = 0.5;
    auVar84._28_4_ = 0.5;
    auVar18 = vfmadd213ps_fma(auVar151,ZEXT1632(auVar18),auVar84);
    auVar18 = vfmadd213ps_fma(_local_1e40,ZEXT1632(auVar18),auVar151);
    local_1de0 = auVar18._0_4_;
    fStack_1ddc = auVar18._4_4_;
    fStack_1dd8 = auVar18._8_4_;
    fStack_1dd4 = auVar18._12_4_;
    local_15e0 = auVar17._0_4_;
    fStack_15dc = auVar17._4_4_;
    fStack_15d8 = auVar17._8_4_;
    fStack_15d4 = auVar17._12_4_;
    fStack_15d0 = auVar17._16_4_;
    fStack_15cc = auVar17._20_4_;
    fStack_15c8 = auVar17._24_4_;
    fStack_15c4 = auVar17._28_4_;
    local_1e80._4_4_ = (int)fStack_15dc;
    local_1e80._0_4_ = (int)local_15e0;
    local_1e80._8_4_ = (int)fStack_15d8;
    local_1e80._12_4_ = (int)fStack_15d4;
    uStack_1e70._0_4_ = (int)fStack_15d0;
    uStack_1e70._4_4_ = (int)fStack_15cc;
    uStack_1e68._0_4_ = (int)fStack_15c8;
    uStack_1e68._4_4_ = (int)fStack_15c4;
    auVar17 = _local_1e80;
    uStack_1e68 = auVar17._24_8_;
    auVar99._16_8_ = uStack_1e70;
    auVar99._0_16_ = local_1e80;
    auVar99._24_8_ = uStack_1e68;
    auVar98._8_8_ = 0x7f0000007f;
    auVar98._0_8_ = 0x7f0000007f;
    auVar98._16_8_ = 0x7f0000007f;
    auVar98._24_8_ = 0x7f0000007f;
    auVar17 = vpaddd_avx2(auVar99,auVar98);
    auVar17 = vpslld_avx2(auVar17,ZEXT416(0x17));
    local_1d80 = auVar17._0_4_;
    fStack_1d7c = auVar17._4_4_;
    fStack_1d78 = auVar17._8_4_;
    fStack_1d74 = auVar17._12_4_;
    fStack_1d70 = auVar17._16_4_;
    fStack_1d6c = auVar17._20_4_;
    fStack_1d68 = auVar17._24_4_;
    local_1ee0._4_4_ = (fStack_1ddc + 1.0) * fStack_1d7c;
    local_1ee0._0_4_ = (local_1de0 + 1.0) * local_1d80;
    uStack_1ed8._0_4_ = (fStack_1dd8 + 1.0) * fStack_1d78;
    uStack_1ed8._4_4_ = (fStack_1dd4 + 1.0) * fStack_1d74;
    uStack_1ed0._0_4_ = fStack_1d70 * 1.0;
    uStack_1ed0._4_4_ = fStack_1d6c * 1.0;
    auVar144 = _local_1ee0;
    uStack_1ec8._0_4_ = fStack_1d68 * 1.0;
    uStack_1ec8._4_4_ = 0x3f800000;
    auVar17 = _local_1ee0;
    uStack_1ed0 = auVar144._16_8_;
    uStack_1ec8 = auVar17._24_8_;
    *local_45e0 = local_1ee0;
    local_45e0[1] = uStack_1ed8;
    local_45e0[2] = uStack_1ed0;
    local_45e0[3] = uStack_1ec8;
    local_45d0 = (undefined1 (*) [64])(*local_45d0 + 0x20);
    local_45e0 = local_45e0 + 4;
  }
  uVar1 = *in_RSI;
  for (; local_45f4 + 3 < iVar145; local_45f4 = local_45f4 + 4) {
    auVar133._8_8_ = CONCAT44(uVar1,uVar1);
    auVar133._0_8_ = CONCAT44(uVar1,uVar1);
    auVar132._8_8_ = CONCAT44(uVar1,uVar1);
    auVar132._0_8_ = CONCAT44(uVar1,uVar1);
    auVar18 = vcmpps_avx(auVar133,ZEXT816(0),2);
    auVar20._8_4_ = 0x800000;
    auVar20._0_8_ = 0x80000000800000;
    auVar20._12_4_ = 0x800000;
    auVar19 = vmaxps_avx(auVar132,auVar20);
    auVar21 = vpsrld_avx(auVar19,ZEXT416(0x17));
    auVar107._8_4_ = 0x807fffff;
    auVar107._0_8_ = 0x807fffff807fffff;
    auVar107._12_4_ = 0x807fffff;
    auVar19 = vpand_avx(auVar19,auVar107);
    auVar129._8_4_ = 0x3f000000;
    auVar129._0_8_ = 0x3f0000003f000000;
    auVar129._12_4_ = 0x3f000000;
    auVar20 = vpor_avx(auVar19,auVar129);
    auVar130._8_8_ = 0x7f0000007f;
    auVar130._0_8_ = 0x7f0000007f;
    auVar19 = vpsubd_avx(auVar21,auVar130);
    auVar19 = vcvtdq2ps_avx(auVar19);
    local_8a0 = auVar19._0_4_;
    fStack_89c = auVar19._4_4_;
    fStack_898 = auVar19._8_4_;
    fStack_894 = auVar19._12_4_;
    local_940 = CONCAT44(fStack_89c + 1.0,local_8a0 + 1.0);
    uStack_938._0_4_ = fStack_898 + 1.0;
    uStack_938._4_4_ = fStack_894 + 1.0;
    auVar131._8_4_ = 0x3f3504f3;
    auVar131._0_8_ = 0x3f3504f33f3504f3;
    auVar131._12_4_ = 0x3f3504f3;
    auVar19 = vcmpps_avx(auVar20,auVar131,1);
    auVar21 = vpand_avx(auVar20,auVar19);
    auVar103._8_8_ = 0x3f8000003f800000;
    auVar103._0_8_ = 0x3f8000003f800000;
    auVar20 = vsubps_avx(auVar20,auVar103);
    auVar106._8_8_ = 0x3f8000003f800000;
    auVar106._0_8_ = 0x3f8000003f800000;
    auVar19 = vpand_avx(auVar106,auVar19);
    auVar102._8_8_ = uStack_938;
    auVar102._0_8_ = local_940;
    auVar19 = vsubps_avx(auVar102,auVar19);
    local_8c0 = auVar20._0_4_;
    fStack_8bc = auVar20._4_4_;
    fStack_8b8 = auVar20._8_4_;
    fStack_8b4 = auVar20._12_4_;
    local_8d0 = auVar21._0_4_;
    fStack_8cc = auVar21._4_4_;
    fStack_8c8 = auVar21._8_4_;
    fStack_8c4 = auVar21._12_4_;
    local_900._0_4_ = local_8c0 + local_8d0;
    local_900._4_4_ = fStack_8bc + fStack_8cc;
    fStack_8f8 = fStack_8b8 + fStack_8c8;
    fStack_8f4 = fStack_8b4 + fStack_8c4;
    fStack_978 = 0.070376836;
    local_980 = (undefined1  [8])0x3d9021bb3d9021bb;
    fStack_974 = 0.070376836;
    auVar119._8_4_ = -0.1151461;
    auVar119._12_4_ = -0.1151461;
    auVar119._0_4_ = -0.1151461;
    auVar119._4_4_ = -0.1151461;
    auVar21 = vfmadd213ps_fma(_local_900,_local_980,auVar119);
    auVar120._8_4_ = 0.116769984;
    auVar120._12_4_ = 0.116769984;
    auVar120._0_4_ = 0.116769984;
    auVar120._4_4_ = 0.116769984;
    auVar21 = vfmadd213ps_fma(_local_900,auVar21,auVar120);
    auVar121._8_4_ = -0.12420141;
    auVar121._12_4_ = -0.12420141;
    auVar121._0_4_ = -0.12420141;
    auVar121._4_4_ = -0.12420141;
    auVar21 = vfmadd213ps_fma(_local_900,auVar21,auVar121);
    auVar122._8_4_ = 0.14249323;
    auVar122._12_4_ = 0.14249323;
    auVar122._0_4_ = 0.14249323;
    auVar122._4_4_ = 0.14249323;
    auVar21 = vfmadd213ps_fma(_local_900,auVar21,auVar122);
    auVar123._8_4_ = -0.16668057;
    auVar123._12_4_ = -0.16668057;
    auVar123._0_4_ = -0.16668057;
    auVar123._4_4_ = -0.16668057;
    auVar21 = vfmadd213ps_fma(_local_900,auVar21,auVar123);
    auVar124._8_4_ = 0.20000714;
    auVar124._12_4_ = 0.20000714;
    auVar124._0_4_ = 0.20000714;
    auVar124._4_4_ = 0.20000714;
    auVar21 = vfmadd213ps_fma(_local_900,auVar21,auVar124);
    auVar125._8_4_ = -0.24999994;
    auVar125._12_4_ = -0.24999994;
    auVar125._0_4_ = -0.24999994;
    auVar125._4_4_ = -0.24999994;
    auVar21 = vfmadd213ps_fma(_local_900,auVar21,auVar125);
    auVar126._8_4_ = 0.3333333;
    auVar126._12_4_ = 0.3333333;
    auVar126._0_4_ = 0.3333333;
    auVar126._4_4_ = 0.3333333;
    auVar21 = vfmadd213ps_fma(_local_900,auVar21,auVar126);
    local_820 = auVar21._0_4_;
    fStack_81c = auVar21._4_4_;
    fStack_818 = auVar21._8_4_;
    fStack_814 = auVar21._12_4_;
    local_980._4_4_ =
         fStack_81c * (float)local_900._4_4_ * (float)local_900._4_4_ * (float)local_900._4_4_;
    local_980._0_4_ =
         local_820 * (float)local_900._0_4_ * (float)local_900._0_4_ * (float)local_900._0_4_;
    fStack_978 = fStack_818 * fStack_8f8 * fStack_8f8 * fStack_8f8;
    fStack_974 = fStack_814 * fStack_8f4 * fStack_8f4 * fStack_8f4;
    auVar127._8_4_ = -0.00021219444;
    auVar127._12_4_ = -0.00021219444;
    auVar127._0_4_ = -0.00021219444;
    auVar127._4_4_ = -0.00021219444;
    auVar21 = vfmadd213ps_fma(auVar127,auVar19,_local_980);
    auVar137._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
    auVar137._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
    auVar137._8_4_ = fStack_8f8 * fStack_8f8;
    auVar137._12_4_ = fStack_8f4 * fStack_8f4;
    auVar113._8_4_ = 0.5;
    auVar113._12_4_ = 0.5;
    auVar113._0_4_ = 0.5;
    auVar113._4_4_ = 0.5;
    auVar21 = vfnmadd213ps_fma(auVar113,auVar137,auVar21);
    local_8f0 = auVar21._0_4_;
    fStack_8ec = auVar21._4_4_;
    fStack_8e8 = auVar21._8_4_;
    fStack_8e4 = auVar21._12_4_;
    local_900._4_4_ = (float)local_900._4_4_ + fStack_8ec;
    local_900._0_4_ = (float)local_900._0_4_ + local_8f0;
    fStack_8f8 = fStack_8f8 + fStack_8e8;
    fStack_8f4 = fStack_8f4 + fStack_8e4;
    auVar128._8_4_ = 0.6933594;
    auVar128._12_4_ = 0.6933594;
    auVar128._0_4_ = 0.6933594;
    auVar128._4_4_ = 0.6933594;
    auVar19 = vfmadd213ps_fma(auVar128,auVar19,_local_900);
    auVar18 = vpor_avx(auVar19,auVar18);
    local_b10 = (float)*(undefined8 *)*local_45d0;
    fStack_b0c = (float)((ulong)*(undefined8 *)*local_45d0 >> 0x20);
    fStack_b08 = (float)*(undefined8 *)(*local_45d0 + 8);
    fStack_b04 = (float)((ulong)*(undefined8 *)(*local_45d0 + 8) >> 0x20);
    local_b20 = auVar18._0_4_;
    fStack_b1c = auVar18._4_4_;
    fStack_b18 = auVar18._8_4_;
    fStack_b14 = auVar18._12_4_;
    local_a90 = CONCAT44(fStack_b0c * fStack_b1c,local_b10 * local_b20);
    uStack_a88._0_4_ = fStack_b08 * fStack_b18;
    uStack_a88._4_4_ = fStack_b04 * fStack_b14;
    auVar21._8_8_ = uStack_a88;
    auVar21._0_8_ = local_a90;
    auVar18._8_4_ = 0x42b0c0a5;
    auVar18._0_8_ = 0x42b0c0a542b0c0a5;
    auVar18._12_4_ = 0x42b0c0a5;
    auVar18 = vminps_avx(auVar21,auVar18);
    auVar19._8_4_ = 0xc2b0c0a5;
    auVar19._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar19._12_4_ = 0xc2b0c0a5;
    auVar21 = vmaxps_avx(auVar18,auVar19);
    local_9d0 = auVar21._0_4_;
    fStack_9cc = auVar21._4_4_;
    fStack_9c8 = auVar21._8_4_;
    fStack_9c4 = auVar21._12_4_;
    fVar150 = local_9d0 * 1.442695 + 0.5;
    fVar152 = fStack_9cc * 1.442695 + 0.5;
    fVar153 = fStack_9c8 * 1.442695 + 0.5;
    fVar154 = fStack_9c4 * 1.442695 + 0.5;
    local_ab0 = CONCAT44(fVar152,fVar150);
    uStack_aa8._0_4_ = fVar153;
    uStack_aa8._4_4_ = fVar154;
    local_ac0 = CONCAT44((int)fVar152,(int)fVar150);
    uStack_ab8._0_4_ = (int)fVar153;
    uStack_ab8._4_4_ = (int)fVar154;
    auVar104._8_8_ = uStack_ab8;
    auVar104._0_8_ = local_ac0;
    auVar19 = vcvtdq2ps_avx(auVar104);
    auVar105._8_8_ = uStack_aa8;
    auVar105._0_8_ = local_ab0;
    auVar18 = vcmpps_avx(auVar105,auVar19,1);
    auVar108._8_8_ = 0x3f8000003f800000;
    auVar108._0_8_ = 0x3f8000003f800000;
    auVar18 = vpand_avx(auVar18,auVar108);
    auVar18 = vsubps_avx(auVar19,auVar18);
    auVar111._8_4_ = 0.6933594;
    auVar111._12_4_ = 0.6933594;
    auVar111._0_4_ = 0.6933594;
    auVar111._4_4_ = 0.6933594;
    auVar19 = vfnmadd213ps_fma(auVar111,auVar18,auVar21);
    auVar112._8_4_ = -0.00021219444;
    auVar112._12_4_ = -0.00021219444;
    auVar112._0_4_ = -0.00021219444;
    auVar112._4_4_ = -0.00021219444;
    auVar21 = vfnmadd213ps_fma(auVar112,auVar18,auVar19);
    local_9f0 = auVar21._0_4_;
    fStack_9ec = auVar21._4_4_;
    fStack_9e8 = auVar21._8_4_;
    fStack_9e4 = auVar21._12_4_;
    local_aa0._4_4_ = fStack_9ec * fStack_9ec;
    local_aa0._0_4_ = local_9f0 * local_9f0;
    fStack_a98 = fStack_9e8 * fStack_9e8;
    fStack_a94 = fStack_9e4 * fStack_9e4;
    uStack_ae8._0_4_ = 0x39506967;
    local_af0 = (undefined1  [8])0x3950696739506967;
    uStack_ae8._4_4_ = 0x39506967;
    auVar114._8_4_ = 0.0013981999;
    auVar114._12_4_ = 0.0013981999;
    auVar114._0_4_ = 0.0013981999;
    auVar114._4_4_ = 0.0013981999;
    auVar19 = vfmadd213ps_fma(auVar21,_local_af0,auVar114);
    auVar115._8_4_ = 0.008333452;
    auVar115._12_4_ = 0.008333452;
    auVar115._0_4_ = 0.008333452;
    auVar115._4_4_ = 0.008333452;
    auVar19 = vfmadd213ps_fma(auVar21,auVar19,auVar115);
    auVar116._8_4_ = 0.041665796;
    auVar116._12_4_ = 0.041665796;
    auVar116._0_4_ = 0.041665796;
    auVar116._4_4_ = 0.041665796;
    auVar19 = vfmadd213ps_fma(auVar21,auVar19,auVar116);
    auVar117._8_4_ = 0.16666666;
    auVar117._12_4_ = 0.16666666;
    auVar117._0_4_ = 0.16666666;
    auVar117._4_4_ = 0.16666666;
    auVar19 = vfmadd213ps_fma(auVar21,auVar19,auVar117);
    auVar118._8_4_ = 0.5;
    auVar118._12_4_ = 0.5;
    auVar118._0_4_ = 0.5;
    auVar118._4_4_ = 0.5;
    auVar19 = vfmadd213ps_fma(auVar21,auVar19,auVar118);
    auVar19 = vfmadd213ps_fma(_local_aa0,auVar19,auVar21);
    local_a70 = auVar19._0_4_;
    fStack_a6c = auVar19._4_4_;
    fStack_a68 = auVar19._8_4_;
    fStack_a64 = auVar19._12_4_;
    local_7b0 = auVar18._0_4_;
    fStack_7ac = auVar18._4_4_;
    fStack_7a8 = auVar18._8_4_;
    fStack_7a4 = auVar18._12_4_;
    local_ac0 = CONCAT44((int)fStack_7ac,(int)local_7b0);
    uStack_ab8._0_4_ = (int)fStack_7a8;
    uStack_ab8._4_4_ = (int)fStack_7a4;
    auVar110._8_8_ = uStack_ab8;
    auVar110._0_8_ = local_ac0;
    auVar109._8_8_ = 0x7f0000007f;
    auVar109._0_8_ = 0x7f0000007f;
    auVar18 = vpaddd_avx(auVar110,auVar109);
    auVar18 = vpslld_avx(auVar18,ZEXT416(0x17));
    local_a20 = auVar18._0_4_;
    fStack_a1c = auVar18._4_4_;
    fStack_a18 = auVar18._8_4_;
    fStack_a14 = auVar18._12_4_;
    local_af0._4_4_ = (fStack_a6c + 1.0) * fStack_a1c;
    local_af0._0_4_ = (local_a70 + 1.0) * local_a20;
    uStack_ae8._0_4_ = (fStack_a68 + 1.0) * fStack_a18;
    uStack_ae8._4_4_ = (fStack_a64 + 1.0) * fStack_a14;
    *local_45e0 = local_af0;
    local_45e0[1] = uStack_ae8;
    local_45d0 = (undefined1 (*) [64])(*local_45d0 + 0x10);
    local_45e0 = local_45e0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}